

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void execute(Grasp *grasp,seconds timeout)

{
  thread t;
  unique_lock<std::mutex> l;
  Grasp *grasp_local;
  seconds timeout_local;
  mutex m;
  condition_variable cv;
  
  m.super___mutex_base._M_mutex._16_8_ = 0;
  m.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  m.super___mutex_base._M_mutex.__align = 0;
  m.super___mutex_base._M_mutex._8_8_ = 0;
  m.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  grasp_local = grasp;
  timeout_local = timeout;
  std::condition_variable::condition_variable(&cv);
  t._M_id._M_thread = (id)0;
  l._M_device = (mutex_type *)operator_new(0x20);
  ((l._M_device)->super___mutex_base)._M_mutex.__align = (long)&PTR___State_00126cc8;
  *(mutex **)((long)&((l._M_device)->super___mutex_base)._M_mutex + 8) = &m;
  *(condition_variable **)((long)&((l._M_device)->super___mutex_base)._M_mutex + 0x10) = &cv;
  ((l._M_device)->super___mutex_base)._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)&grasp_local;
  std::thread::_M_start_thread(&t,&l,0);
  if (l._M_device != (mutex_type *)0x0) {
    (**(code **)(((l._M_device)->super___mutex_base)._M_mutex.__align + 8))();
  }
  std::thread::detach();
  std::unique_lock<std::mutex>::unique_lock(&l,&m);
  std::condition_variable::wait_for<long,std::ratio<1l,1l>>(&cv,&l,&timeout_local);
  std::unique_lock<std::mutex>::~unique_lock(&l);
  std::thread::~thread(&t);
  std::condition_variable::~condition_variable(&cv);
  return;
}

Assistant:

void execute(Grasp *grasp, chrono::seconds timeout) {
    mutex m;
    condition_variable cv;

    thread t([&m, &cv, &grasp]()
             {
                 grasp->run(true);
                 cv.notify_one();
             });

    t.detach();

    unique_lock<mutex> l(m);
    cv.wait_for(l, timeout);
}